

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,Port *var)

{
  add_info(this,&var->super_Var);
  return;
}

Assistant:

void visit(Port *var) override { add_info(var); }